

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * __thiscall Production::toStr_abi_cxx11_(string *__return_storage_ptr__,Production *this)

{
  pointer pbVar1;
  long lVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string uniqueID;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uniqueID,"",(allocator<char> *)&state);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&state);
  std::operator+(&local_70,"#PROD.FROM#\n",&this->fromP);
  std::operator+(&state,&local_70,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&state);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar1 = (this->toP).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = 1;
  for (pbVar3 = (this->toP).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&state,(string *)pbVar3);
    std::operator+(&local_70,"#PROD.STATE#\n",&state);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    if (lVar2 != (long)(this->toP).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->toP).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&state);
    lVar2 = lVar2 + 1;
  }
  std::__cxx11::string::~string((string *)&uniqueID);
  return __return_storage_ptr__;
}

Assistant:

std::string Production::toStr() {
    std::string uniqueID = "";
    std::string returnStr = "";

    // from
    returnStr += "#PROD.FROM#\n" + fromP + "\n";
    returnStr += "#PROD.STATES#\n";

    // to
    int i = 0;
    for (auto state: toP) {
        i++;
        returnStr += "#PROD.STATE#\n" + state;
        if (i != toP.size()) {
            returnStr += "\n";
        }
    }

    return returnStr;
}